

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

XSIDCDefinition * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,IdentityConstraint *ic,XSModel *xsModel)

{
  int iVar1;
  XMLCh *maxElems;
  IC_Field *this_00;
  XercesXPath *this_01;
  XMLCh *pXVar2;
  IdentityConstraint *ic_00;
  XSAnnotation *headAnnot;
  XMLCh *expr;
  XMLSize_t i;
  XMLSize_t fieldCount;
  StringList *stringList;
  XSIDCDefinition *keyIC;
  XSIDCDefinition *xsObj;
  XSModel *xsModel_local;
  IdentityConstraint *ic_local;
  XSObjectFactory *this_local;
  
  keyIC = (XSIDCDefinition *)XSModel::getXSObject(xsModel,ic);
  if (keyIC == (XSIDCDefinition *)0x0) {
    stringList = (StringList *)0x0;
    fieldCount = 0;
    maxElems = (XMLCh *)IdentityConstraint::getFieldCount(ic);
    if (maxElems != (XMLCh *)0x0) {
      fieldCount = (XMLSize_t)XMemory::operator_new(0x30,this->fMemoryManager);
      RefArrayVectorOf<char16_t>::RefArrayVectorOf
                ((RefArrayVectorOf<char16_t> *)fieldCount,(XMLSize_t)maxElems,true,
                 this->fMemoryManager);
      for (expr = (XMLCh *)0x0; expr < maxElems; expr = (XMLCh *)((long)expr + 1)) {
        this_00 = IdentityConstraint::getFieldAt(ic,(XMLSize_t)expr);
        this_01 = IC_Field::getXPath(this_00);
        pXVar2 = XercesXPath::getExpression(this_01);
        pXVar2 = XMLString::replicate(pXVar2,this->fMemoryManager);
        BaseRefVectorOf<char16_t>::addElement((BaseRefVectorOf<char16_t> *)fieldCount,pXVar2);
      }
    }
    iVar1 = (*(ic->super_XSerializable)._vptr_XSerializable[5])();
    if ((short)iVar1 == 2) {
      ic_00 = IC_KeyRef::getKey((IC_KeyRef *)ic);
      stringList = (StringList *)addOrFind(this,ic_00,xsModel);
    }
    keyIC = (XSIDCDefinition *)XMemory::operator_new(0x48,this->fMemoryManager);
    headAnnot = getAnnotationFromModel(this,xsModel,ic);
    XSIDCDefinition::XSIDCDefinition
              (keyIC,ic,(XSIDCDefinition *)stringList,headAnnot,(StringList *)fieldCount,xsModel,
               this->fMemoryManager);
    putObjectInMap(this,ic,(XSObject *)keyIC);
  }
  return keyIC;
}

Assistant:

XSIDCDefinition* XSObjectFactory::addOrFind(IdentityConstraint* const ic,
                                            XSModel* const xsModel)
{
    XSIDCDefinition* xsObj = (XSIDCDefinition*) xsModel->getXSObject(ic);
    if (!xsObj)
    {
        XSIDCDefinition* keyIC = 0;
        StringList*      stringList = 0;
        XMLSize_t        fieldCount = ic->getFieldCount();

        if (fieldCount)
        {
            stringList = new (fMemoryManager) RefArrayVectorOf<XMLCh>(
                fieldCount, true, fMemoryManager);

            for(XMLSize_t i=0; i<fieldCount; i++)
            {
                XMLCh* expr = XMLString::replicate
                (
                    ic->getFieldAt(i)->getXPath()->getExpression()
                    , fMemoryManager
                );
                stringList->addElement(expr);
            }
        }

        if (ic->getType() == IdentityConstraint::ICType_KEYREF)
            keyIC = addOrFind(((IC_KeyRef*) ic)->getKey(), xsModel);

        xsObj= new (fMemoryManager) XSIDCDefinition
        (
            ic
            , keyIC
            , getAnnotationFromModel(xsModel, ic)
            , stringList
            , xsModel
            , fMemoryManager
        );
        putObjectInMap(ic, xsObj);
    }

    return xsObj;
}